

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O2

int WebPPictureCopy(WebPPicture *src,WebPPicture *dst)

{
  int iVar1;
  int dst_stride;
  uint32_t *dst_00;
  int src_stride;
  uint32_t *src_00;
  int width;
  
  if (dst == (WebPPicture *)0x0 || src == (WebPPicture *)0x0) {
    return 0;
  }
  if (src != dst) {
    memcpy(dst,src,0x100);
    WebPPictureResetBuffers(dst);
    iVar1 = WebPPictureAlloc(dst);
    if (iVar1 == 0) {
      return 0;
    }
    if (src->use_argb == 0) {
      WebPCopyPlane(src->y,src->y_stride,dst->y,dst->y_stride,dst->width,dst->height);
      WebPCopyPlane(src->u,src->uv_stride,dst->u,dst->uv_stride,dst->width + 1 >> 1,
                    dst->height + 1 >> 1);
      WebPCopyPlane(src->v,src->uv_stride,dst->v,dst->uv_stride,dst->width + 1 >> 1,
                    dst->height + 1 >> 1);
      dst_00 = (uint32_t *)dst->a;
      if (dst_00 == (uint32_t *)0x0) {
        return 1;
      }
      src_00 = (uint32_t *)src->a;
      src_stride = src->a_stride;
      dst_stride = dst->a_stride;
      width = dst->width;
      iVar1 = dst->height;
    }
    else {
      src_00 = src->argb;
      src_stride = src->argb_stride << 2;
      dst_00 = dst->argb;
      dst_stride = dst->argb_stride << 2;
      iVar1 = dst->height;
      width = dst->width << 2;
    }
    WebPCopyPlane((uint8_t *)src_00,src_stride,(uint8_t *)dst_00,dst_stride,width,iVar1);
  }
  return 1;
}

Assistant:

int WebPPictureCopy(const WebPPicture* src, WebPPicture* dst) {
  if (src == NULL || dst == NULL) return 0;
  if (src == dst) return 1;

  PictureGrabSpecs(src, dst);
  if (!WebPPictureAlloc(dst)) return 0;

  if (!src->use_argb) {
    WebPCopyPlane(src->y, src->y_stride,
                  dst->y, dst->y_stride, dst->width, dst->height);
    WebPCopyPlane(src->u, src->uv_stride, dst->u, dst->uv_stride,
                  HALVE(dst->width), HALVE(dst->height));
    WebPCopyPlane(src->v, src->uv_stride, dst->v, dst->uv_stride,
                  HALVE(dst->width), HALVE(dst->height));
    if (dst->a != NULL)  {
      WebPCopyPlane(src->a, src->a_stride,
                    dst->a, dst->a_stride, dst->width, dst->height);
    }
  } else {
    WebPCopyPlane((const uint8_t*)src->argb, 4 * src->argb_stride,
                  (uint8_t*)dst->argb, 4 * dst->argb_stride,
                  4 * dst->width, dst->height);
  }
  return 1;
}